

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenavitHartenberg.cpp
# Opt level: O2

bool iDynTree::calculateDH
               (Axis *zAxis_i_minus_1,Axis *xAxis_i_minus_1,Position *origin_i_minus_1,Axis *zAxis_i
               ,Direction *xAxis_n_direction_hint,Position *origin_i,Axis *xAxis_i,Axis *yAxis_i,
               DHLink *dhParams,double tol,int verbose)

{
  ResScalar RVar1;
  ResScalar RVar2;
  ResScalar RVar3;
  ResScalar RVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  Position *pPVar9;
  ulong uVar10;
  long lVar11;
  Direction y_i_candidate;
  Vector3d x_i_candidate_eig;
  Position x_i_z_i_minus_1_intersection_A;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_248;
  Direction x_i_candidate;
  Position x_i_z_i_minus_1_intersection_B;
  undefined8 local_1d8 [2];
  Position point_on_zAxis_i_minus_1_closest_to_zAxis_i;
  Axis local_1b0;
  Axis local_180;
  Axis local_150;
  Axis local_120;
  Axis local_f0;
  Axis local_c0;
  Axis local_90;
  Axis local_60;
  
  iDynTree::Position::Position(&point_on_zAxis_i_minus_1_closest_to_zAxis_i);
  iDynTree::Axis::Axis(&local_60,zAxis_i_minus_1);
  iDynTree::Axis::Axis(&local_90,zAxis_i);
  bVar6 = closestPoints(&local_60,&local_90,&point_on_zAxis_i_minus_1_closest_to_zAxis_i,origin_i,
                        tol);
  if (!bVar6) {
    pPVar9 = (Position *)iDynTree::Axis::getOrigin();
    iDynTree::Position::operator=(origin_i,pPVar9);
  }
  iDynTree::Axis::setOrigin((Position *)xAxis_i);
  iDynTree::Axis::setOrigin((Position *)yAxis_i);
  iDynTree::Axis::Axis(&local_c0,zAxis_i_minus_1);
  iDynTree::Axis::Axis(&local_f0,zAxis_i);
  bVar6 = checkIfAxesAreIncident(&local_c0,&local_f0,1e-06);
  iDynTree::Axis::Axis(&local_120,zAxis_i_minus_1);
  iDynTree::Axis::Axis(&local_150,zAxis_i);
  bVar7 = checkIfAxesAreCoincident(&local_120,&local_150,1e-06);
  if (bVar6) {
    if (bVar7) {
      y_i_candidate.super_Vector3.m_data[0] = 0.0;
      y_i_candidate.super_Vector3.m_data[1] = 0.0;
      y_i_candidate.super_Vector3.m_data[2] = 0.0;
      std::vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>::push_back
                ((vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_> *)&y_i_candidate
                 ,xAxis_n_direction_hint);
      iDynTree::Direction::Direction(&x_i_candidate,1.0,0.0,0.0);
      std::vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>::
      emplace_back<iDynTree::Direction>
                ((vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_> *)&y_i_candidate
                 ,&x_i_candidate);
      iDynTree::Direction::Direction(&x_i_candidate,0.0,1.0,0.0);
      std::vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>::
      emplace_back<iDynTree::Direction>
                ((vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_> *)&y_i_candidate
                 ,&x_i_candidate);
      iDynTree::Direction::Direction(&x_i_candidate,0.0,0.0,1.0);
      std::vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>::
      emplace_back<iDynTree::Direction>
                ((vector<iDynTree::Direction,_std::allocator<iDynTree::Direction>_> *)&y_i_candidate
                 ,&x_i_candidate);
      lVar11 = -0x18;
      uVar10 = 0xffffffffffffffff;
      do {
        dVar5 = y_i_candidate.super_Vector3.m_data[0];
        uVar10 = uVar10 + 1;
        if ((ulong)(((long)y_i_candidate.super_Vector3.m_data[1] -
                    (long)y_i_candidate.super_Vector3.m_data[0]) / 0x18) <= uVar10)
        goto LAB_0018fa0b;
        iDynTree::Axis::getDirection();
        cVar8 = iDynTree::Direction::isParallel((Direction *)((long)dVar5 + lVar11 + 0x18),tol);
        lVar11 = lVar11 + 0x18;
      } while (cVar8 != '\0');
      iDynTree::Direction::operator=
                ((Direction *)&x_i_z_i_minus_1_intersection_A,
                 (Direction *)(lVar11 + (long)y_i_candidate.super_Vector3.m_data[0]));
LAB_0018fa0b:
      x_i_candidate.super_Vector3.m_data[0] = (double)iDynTree::Axis::getDirection();
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&x_i_z_i_minus_1_intersection_B
                 ,(DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                   *)&x_i_candidate);
      local_248._0_8_ = &x_i_z_i_minus_1_intersection_A;
      Eigen::internal::
      dot_nocheck<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
      ::run((MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
             *)&local_248,
            (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&x_i_z_i_minus_1_intersection_B);
      x_i_candidate.super_Vector3.m_data[0] = (double)&x_i_z_i_minus_1_intersection_A;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&x_i_candidate_eig,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  *)&x_i_candidate);
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&x_i_candidate_eig);
      local_248._0_8_ =
           (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
            *)&x_i_candidate;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::Matrix<double,3,1,0,3,1>>
                (&local_248,&x_i_candidate_eig);
      iDynTree::Axis::setDirection(&xAxis_i->direction);
      std::operator<<((ostream *)&std::cerr,
                      "ExtractDHChainFromModel : DH representation is not unique, made an arbitrary choice for x_i direction\n"
                     );
      std::_Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_>::~_Vector_base
                ((_Vector_base<iDynTree::Direction,_std::allocator<iDynTree::Direction>_> *)
                 &y_i_candidate);
    }
    else {
      y_i_candidate.super_Vector3.m_data[0] = (double)iDynTree::Axis::getDirection();
      _x_i_z_i_minus_1_intersection_A = (Position *)iDynTree::Axis::getDirection();
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
      cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
                ((type *)&x_i_candidate,&y_i_candidate,
                 (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&x_i_z_i_minus_1_intersection_A);
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&x_i_candidate);
      y_i_candidate.super_Vector3.m_data[0] = (double)xAxis_n_direction_hint;
      RVar4 = Eigen::internal::
              dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_false>
              ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&x_i_candidate,
                    (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                     *)&y_i_candidate);
      if (RVar4 < 0.0) {
        y_i_candidate.super_Vector3.m_data[0] = (double)&x_i_candidate;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>>
                  ((Matrix<double,_3,_1,_0,_3,_1> *)&x_i_candidate,
                   (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&y_i_candidate);
      }
      _x_i_z_i_minus_1_intersection_A = (Position *)&y_i_candidate;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::Matrix<double,3,1,0,3,1>>
                ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 &x_i_z_i_minus_1_intersection_A,(Matrix<double,_3,_1,_0,_3,_1> *)&x_i_candidate);
      iDynTree::Axis::setDirection(&xAxis_i->direction);
      std::operator<<((ostream *)&std::cerr,
                      "ExtractDHChainFromModel : DH representation is not unique, made an arbitrary choice for x_i sign\n"
                     );
    }
  }
  else {
    iDynTree::Position::operator-((Position *)&x_i_candidate,origin_i);
    _x_i_z_i_minus_1_intersection_A = (Position *)&x_i_candidate;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&y_i_candidate,
               (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)&x_i_z_i_minus_1_intersection_A);
    _x_i_z_i_minus_1_intersection_B =
         (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
          *)iDynTree::Axis::getDirection();
    Eigen::internal::
    dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_false>
    ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&y_i_candidate,
          (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
           *)&x_i_z_i_minus_1_intersection_B);
    iDynTree::Axis::getDirection();
    x_i_candidate.super_Vector3.m_data[0] = (double)&y_i_candidate;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&x_i_z_i_minus_1_intersection_A,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
                *)&x_i_candidate);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&x_i_z_i_minus_1_intersection_A)
    ;
    _x_i_z_i_minus_1_intersection_B =
         (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
          *)&x_i_candidate;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
               &x_i_z_i_minus_1_intersection_B,
               (Matrix<double,_3,_1,_0,_3,_1> *)&x_i_z_i_minus_1_intersection_A);
    iDynTree::Axis::setDirection(&xAxis_i->direction);
  }
  _x_i_z_i_minus_1_intersection_A = (Position *)iDynTree::Axis::getDirection();
  _x_i_z_i_minus_1_intersection_B =
       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
        *)iDynTree::Axis::getDirection();
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((type *)&x_i_candidate,&x_i_z_i_minus_1_intersection_A,
             (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&x_i_z_i_minus_1_intersection_B);
  x_i_candidate_eig.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[0] = (double)&y_i_candidate;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::Matrix<double,3,1,0,3,1>>
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
             &x_i_candidate_eig,(type *)&x_i_candidate);
  iDynTree::Axis::setDirection(&yAxis_i->direction);
  iDynTree::Position::Position(&x_i_z_i_minus_1_intersection_A);
  iDynTree::Position::Position(&x_i_z_i_minus_1_intersection_B);
  iDynTree::Axis::Axis(&local_180,zAxis_i_minus_1);
  iDynTree::Axis::Axis(&local_1b0,xAxis_i);
  closestPoints(&local_180,&local_1b0,&x_i_z_i_minus_1_intersection_A,
                &x_i_z_i_minus_1_intersection_B,tol);
  x_i_candidate.super_Vector3.m_data[0] = (double)&x_i_z_i_minus_1_intersection_B;
  x_i_candidate.super_Vector3.m_data[2] = (double)origin_i;
  x_i_candidate_eig.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[0] = (double)iDynTree::Axis::getDirection();
  RVar1 = Eigen::internal::
          dot_nocheck<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_false>
          ::run((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                 *)&x_i_candidate,
                (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)&x_i_candidate_eig);
  dhParams->A = -RVar1;
  x_i_candidate.super_Vector3.m_data[0] = (double)&x_i_z_i_minus_1_intersection_A;
  x_i_candidate.super_Vector3.m_data[2] = (double)origin_i_minus_1;
  x_i_candidate_eig.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[0] = (double)iDynTree::Axis::getDirection();
  RVar2 = Eigen::internal::
          dot_nocheck<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_false>
          ::run((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                 *)&x_i_candidate,
                (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)&x_i_candidate_eig);
  dhParams->D = RVar2;
  x_i_candidate.super_Vector3.m_data[0] = (double)iDynTree::Axis::getDirection();
  x_i_candidate_eig.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[0] = (double)iDynTree::Axis::getDirection();
  RVar3 = Eigen::internal::
          dot_nocheck<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_false>
          ::run((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)&x_i_candidate,
                (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)&x_i_candidate_eig);
  x_i_candidate_eig.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[0] = (double)iDynTree::Axis::getDirection();
  local_248._0_8_ = iDynTree::Axis::getDirection();
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((type *)&x_i_candidate,&x_i_candidate_eig,
             (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_248);
  local_1d8[0] = iDynTree::Axis::getDirection();
  RVar4 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_false>
          ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&x_i_candidate,
                (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)local_1d8);
  dVar5 = atan2(RVar4,RVar3);
  dhParams->Alpha = dVar5;
  x_i_candidate.super_Vector3.m_data[0] = (double)iDynTree::Axis::getDirection();
  x_i_candidate_eig.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[0] = (double)iDynTree::Axis::getDirection();
  RVar3 = Eigen::internal::
          dot_nocheck<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_false>
          ::run((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)&x_i_candidate,
                (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)&x_i_candidate_eig);
  x_i_candidate_eig.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[0] = (double)iDynTree::Axis::getDirection();
  local_248._0_8_ = iDynTree::Axis::getDirection();
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((type *)&x_i_candidate,&x_i_candidate_eig,
             (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_248);
  local_1d8[0] = iDynTree::Axis::getDirection();
  RVar4 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_false>
          ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&x_i_candidate,
                (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)local_1d8);
  dVar5 = atan2(RVar4,RVar3);
  dhParams->Offset = dVar5;
  return true;
}

Assistant:

bool calculateDH(const iDynTree::Axis zAxis_i_minus_1,
                 const iDynTree::Axis xAxis_i_minus_1,
                 const iDynTree::Position origin_i_minus_1,
                 const iDynTree::Axis zAxis_i,
                 const iDynTree::Direction xAxis_n_direction_hint,
                       iDynTree::Position & origin_i,
                       iDynTree::Axis & xAxis_i,
                       iDynTree::Axis & yAxis_i,
                       DHLink & dhParams,
                       double tol = 1e-6,
                       int verbose = 0)
{
    // STEP 3 : Locate O_i (the origin of i-th frame)
    //          Locate the origin O_i where the common normal to z_i and z_{i-1} intersects
    //          z_i . If z_i intersects z_{i-1}, locate O_i at this intersection. If z_i and
    //          z_{i-1} are parallel, locate O_i to any convenenient location along z_i .
    bool zAxes_not_parallel;
    iDynTree::Position point_on_zAxis_i_minus_1_closest_to_zAxis_i;

    // Compute the closest point of the axis z_i-1 and z_i
    // During this computation we get as a byproduct if the two
    // axis are parallel. If the axis are not parallel, then the
    // origin of the frame i is given by the point on z_i closest
    // to z_i_minus_1
    zAxes_not_parallel = closestPoints(zAxis_i_minus_1,
                                 zAxis_i,
                                 point_on_zAxis_i_minus_1_closest_to_zAxis_i,
                                 origin_i,
                                 tol);

    if( !zAxes_not_parallel )
    {
        //if parallel, the origin is not specified and we resort to the original one of the chain
        origin_i = zAxis_i.getOrigin();
    }

    // At this point, we can already set the origin of the the axis of i-th frame

    // \todo check that origin_i actually lies on zAxis_i

    xAxis_i.setOrigin(origin_i);
    yAxis_i.setOrigin(origin_i);

    //
    // We check if z_i and z_i-1 are incident
    //
    bool zAxes_incident = checkIfAxesAreIncident(zAxis_i_minus_1,zAxis_i);

    bool zAxes_coincident = checkIfAxesAreCoincident(zAxis_i_minus_1,zAxis_i);

    //STEP 4 : Establish the direction of x axis of the i-th frame
    //         Establish x_i along the common normal between z_{i-1} and z_i throught O_i,
    //         or in the direction normal to the z_{i-1} - z_{i} plane if z_{i-1} and z_i intersect.

    // While the book distingush just two cases for STEP 4 , we need to actually distinguish three
    // different cases :
    // * z_{i-1} and z_{i} are not incident : in this case the direction of the common normal is always defined,
    //   and in particular we compute it as the difference between the two origins, projected on the spaces
    //   orthogonal to z_i.
    // * z_{i-1} and z_{i} are incident, but not coincident: then the two axis define a plane with a unique axis
    // * z_{i-1} and z_{i} are coincident (i.e. incident and parallel): in this case there are infinite normals,
    //   and so we choose x_i using the hint provided (tipically the x_i used in the previous representation).
    if( !zAxes_incident )
    {
        // not incident

        // If the axis are not incident, the x axis is the common normal of the two axis
        Eigen::Vector3d origin_diff = toEigen(origin_i-origin_i_minus_1);

        // To actually get the normal, we remove from the origin_diff the projection on z_i_minus_1
        Eigen::Vector3d x_i_candidate_eig = origin_diff-origin_diff.dot(toEigen(zAxis_i_minus_1.getDirection()))*toEigen(zAxis_i_minus_1.getDirection());

        x_i_candidate_eig.normalize();

        iDynTree::Direction x_i_candidate;
        iDynTree::toEigen(x_i_candidate) = x_i_candidate_eig;

        xAxis_i.setDirection(x_i_candidate);
    }
    else
    {
        if( !zAxes_coincident )
        {
            // incident but not coincident
            Eigen::Vector3d x_i_candidate_eig  = toEigen(zAxis_i_minus_1.getDirection()).cross(toEigen(zAxis_i.getDirection()));
            x_i_candidate_eig.normalize();

            // Check direction, use hint
            //The positive direction of the axis_x_n is arbitrary, however for dealing with limit case (link where
           // only alpha is different from zero)
           double dh_direction_axis_x_n_sign = x_i_candidate_eig.dot(toEigen(xAxis_n_direction_hint) );
           if (dh_direction_axis_x_n_sign < 0.0)
           {
               x_i_candidate_eig = -x_i_candidate_eig;
           }

           iDynTree::Direction x_i_candidate;
           iDynTree::toEigen(x_i_candidate) = x_i_candidate_eig;

           xAxis_i.setDirection(x_i_candidate);

           std::cerr << "ExtractDHChainFromModel : DH representation is not unique, made an arbitrary choice for x_i sign\n";
        }
        else
        {
            // coincident
            // if the two axis are coincident, the direction of dh_direction_axis_x_n is totally arbitrary
            // as long as it is perpendicular to zAxis. We will take then the hint provided by : direction_axis_x_n_hint
            // to get the dh_direction_axis_x_n, we will project direction_axis_x_n_hint onto the plane
            // perpendicular to axis_z_n_minus_1 == axis_z_n, and will normalize the resulting vector
            // if dh_direction_axis_x_n is parallel to the two axis, we just apply the same procedure to (1,0,0), (0,1,0)
            // and (0,0,1) (in the base frame) in this order. At least two of this three vectors will not be parallel with
            // the axis of the joint, and so they can be used as hints for the direction of
            std::vector<iDynTree::Direction> candidateDirectionHints;
            candidateDirectionHints.push_back(xAxis_n_direction_hint);
            candidateDirectionHints.push_back(iDynTree::Direction(1.0, 0.0, 0.0));
            candidateDirectionHints.push_back(iDynTree::Direction(0.0, 1.0, 0.0));
            candidateDirectionHints.push_back(iDynTree::Direction(0.0, 0.0, 1.0));

            iDynTree::Direction xDirectionHintNotParallelToZ;
            for(int k=0; k < candidateDirectionHints.size(); k++)
            {
                if (candidateDirectionHints[k].isParallel(zAxis_i.getDirection(), tol))
                {
                    continue;
                }
                else
                {
                    xDirectionHintNotParallelToZ = candidateDirectionHints[k];
                    break;
                }
            }

            Eigen::Vector3d direction_axis_z_i_eig = toEigen(zAxis_i.getDirection());
            Eigen::Vector3d x_i_candidate_eig = toEigen(xDirectionHintNotParallelToZ) -
                                                toEigen(xDirectionHintNotParallelToZ).dot(direction_axis_z_i_eig) *
                                                direction_axis_z_i_eig;

            x_i_candidate_eig.normalize();

            iDynTree::Direction x_i_candidate;
            iDynTree::toEigen(x_i_candidate) = x_i_candidate_eig;

            xAxis_i.setDirection(x_i_candidate);

            std::cerr << "ExtractDHChainFromModel : DH representation is not unique, made an arbitrary choice for x_i direction\n";
        }
    }

    // STEP 4 ADDENDUM : get y_i

    // Once the direction of axis z_n and x_n has been determined,
    //  the direction of axis y_n is simply given by a cross product to
    //  ensure a right handed coordinates system
    iDynTree::Direction y_i_candidate;
    toEigen(y_i_candidate) = toEigen(zAxis_i.getDirection()).cross(toEigen(xAxis_i.getDirection()));

    yAxis_i.setDirection(y_i_candidate);


    ////////////////////////////////////////////////////////////////////
    // STEP 5: Computation of DH parameters
    ////////////////////////////////////////////////////////////////////

    //calculation of a_i
    //distance along x_i from O_i to the intersection of the x_i and z_{i-1} axes
    iDynTree::Position x_i_z_i_minus_1_intersection_A, x_i_z_i_minus_1_intersection_B;

    closestPoints(zAxis_i_minus_1,
                  xAxis_i,
                  x_i_z_i_minus_1_intersection_A,
                  x_i_z_i_minus_1_intersection_B,
                  tol);

    //x_i and z_{i-1} should intersecate
    assert(checkIfAxesAreIncident(xAxis_i,zAxis_i_minus_1));

    dhParams.A = -(toEigen(x_i_z_i_minus_1_intersection_B)-toEigen(origin_i)).dot(toEigen(xAxis_i.getDirection()));

    //calculation of d_i
    //distance along z_{i-1} from O_{i-1} to the intersection of the x_i and z_{i-1} axes
    dhParams.D = (toEigen(x_i_z_i_minus_1_intersection_A)-toEigen(origin_i_minus_1)).dot(toEigen(zAxis_i_minus_1.getDirection()));

    //calculation of alpha_i
    //angle between z_{i-1} and z_i measured about x_i
    double cos_alpha_i = toEigen(zAxis_i_minus_1.getDirection()).dot(toEigen(zAxis_i.getDirection()));
    //assert(((direction_axis_z_n_minus_1*direction_axis_z_n)*dh_direction_axis_x_n).Norm() < tol);
    double sin_alpha_i = (toEigen(zAxis_i_minus_1.getDirection()).cross(toEigen(zAxis_i.getDirection()))).dot(toEigen(xAxis_i.getDirection()));
    //assert( fabs(cos_alpha_i*cos_alpha_i + sin_alpha_i*sin_alpha_i - 1) < tol);

    dhParams.Alpha = atan2(sin_alpha_i,cos_alpha_i);

    //calculation of theta_i
    //angle between x_{i-1} and x_i measure about z_{i-1}
    double cos_theta_i = toEigen(xAxis_i_minus_1.getDirection()).dot(toEigen(xAxis_i.getDirection()));
    double sin_theta_i = (toEigen(xAxis_i_minus_1.getDirection()).cross(toEigen(xAxis_i.getDirection()))).dot(toEigen(zAxis_i_minus_1.getDirection()));
    dhParams.Offset = atan2(sin_theta_i,cos_theta_i);

    return true;
}